

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_presets.c
# Opt level: O1

lzma_bool lzma_lzma_preset(lzma_options_lzma *options,uint32_t preset)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar4 = preset & 0x1f;
  uVar2 = 1;
  if ((preset & 0x7fffffe0) == 0 && uVar4 < 10) {
    options->preset_dict = (uint8_t *)0x0;
    options->preset_dict_size = 0;
    options->lc = 3;
    options->lp = 0;
    options->pb = 2;
    options->dict_size = 1 << ("\x12\x14\x15\x16\x16\x17\x17\x18\x19\x1a"[uVar4] & 0x1f);
    if (uVar4 < 4) {
      uVar2 = 0x111;
      if (uVar4 < 2) {
        uVar2 = 0x80;
      }
      options->mode = LZMA_MODE_FAST;
      options->mf = LZMA_MF_HC4 - (uVar4 == 0);
      options->nice_len = uVar2;
      uVar1 = (uint)"\x04\b\x180"[uVar4];
    }
    else {
      options->mode = LZMA_MODE_NORMAL;
      options->mf = LZMA_MF_BT4;
      uVar2 = 0x10;
      if (uVar4 != 4) {
        uVar2 = (uint)(uVar4 != 5) * 0x20 + 0x20;
      }
      options->nice_len = uVar2;
      uVar1 = 0;
    }
    options->depth = uVar1;
    uVar2 = 0;
    if ((int)preset < 0) {
      options->mode = LZMA_MODE_NORMAL;
      options->mf = LZMA_MF_BT4;
      uVar3 = 0xc0;
      if ((uVar4 != 3) && (uVar4 != 5)) {
        uVar2 = 0x200;
        uVar3 = 0x111;
      }
      options->nice_len = uVar3;
      options->depth = uVar2;
      return '\0';
    }
  }
  return (lzma_bool)uVar2;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_lzma_preset(lzma_options_lzma *options, uint32_t preset)
{
	static const uint8_t dict_size_values[] = { 18, 20, 21, 22, 22, 23, 23, 24, 25, 26 };
	static const uint8_t depth_values[] = { 4, 8, 24, 48 };

	const uint32_t level = preset & LZMA_PRESET_LEVEL_MASK;
	const uint32_t flags = preset & ~LZMA_PRESET_LEVEL_MASK;
	const uint32_t supported_flags = LZMA_PRESET_EXTREME;

	if (level > 9 || (flags & ~supported_flags))
		return true;

	options->preset_dict = NULL;
	options->preset_dict_size = 0;

	options->lc = LZMA_LC_DEFAULT;
	options->lp = LZMA_LP_DEFAULT;
	options->pb = LZMA_PB_DEFAULT;

	options->dict_size = UINT32_C(1) << dict_size_values[level];

	if (level <= 3) {
		options->mode = LZMA_MODE_FAST;
		options->mf = level == 0 ? LZMA_MF_HC3 : LZMA_MF_HC4;
		options->nice_len = level <= 1 ? 128 : 273;
		options->depth = depth_values[level];
	} else {
		options->mode = LZMA_MODE_NORMAL;
		options->mf = LZMA_MF_BT4;
		options->nice_len = level == 4 ? 16 : level == 5 ? 32 : 64;
		options->depth = 0;
	}

	if (flags & LZMA_PRESET_EXTREME) {
		options->mode = LZMA_MODE_NORMAL;
		options->mf = LZMA_MF_BT4;
		if (level == 3 || level == 5) {
			options->nice_len = 192;
			options->depth = 0;
		} else {
			options->nice_len = 273;
			options->depth = 512;
		}
	}

	return false;
}